

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O2

Token __thiscall slang::parsing::Token::deepClone(Token *this,BumpAllocator *alloc)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uVar2;
  undefined8 in_RCX;
  SourceLocation *pSVar3;
  int __flags;
  undefined8 extraout_RDX;
  __extent_storage<18446744073709551615UL> extraout_RDX_00;
  Info *extraout_RDX_01;
  void *in_R8;
  Trivia *t;
  Trivia *this_00;
  long lVar4;
  Info *pIVar5;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar6;
  string_view sVar7;
  Token TVar8;
  anon_union_12_4_39e54f29_for_Trivia_0 local_78;
  undefined2 local_6c;
  SmallVector<slang::parsing::Trivia,_2UL> triviaBuffer;
  undefined4 extraout_var_01;
  
  if (this->info == (Info *)0x0) {
    uVar2._0_2_ = this->kind;
    uVar2._2_1_ = this->field_0x2;
    uVar2._3_1_ = this->numFlags;
    uVar2._4_4_ = this->rawLen;
    pIVar5 = (Info *)0x0;
  }
  else {
    sVar6 = trivia(this);
    SmallVector<slang::parsing::Trivia,_2UL>::SmallVector
              (&triviaBuffer,sVar6._M_extent._M_extent_value._M_extent_value);
    sVar6 = trivia(this);
    lVar4 = sVar6._M_extent._M_extent_value._M_extent_value << 4;
    while( true ) {
      this_00 = sVar6._M_ptr;
      if (lVar4 == 0) break;
      iVar1 = Trivia::clone(this_00,(__fn *)alloc,(void *)0x1,(int)in_RCX,in_R8);
      local_78.rawText.ptr = (char *)CONCAT44(extraout_var,iVar1);
      local_78.rawText.len = (uint32_t)extraout_RDX;
      local_6c = (undefined2)((ulong)extraout_RDX >> 0x20);
      SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                (&triviaBuffer.super_SmallVectorBase<slang::parsing::Trivia>,
                 (Trivia *)&local_78.rawText);
      sVar6._M_extent._M_extent_value = extraout_RDX_00._M_extent_value;
      sVar6._M_ptr = this_00 + 1;
      lVar4 = lVar4 + -0x10;
    }
    iVar1 = SmallVectorBase<slang::parsing::Trivia>::copy
                      (&triviaBuffer.super_SmallVectorBase<slang::parsing::Trivia>,
                       (EVP_PKEY_CTX *)alloc,
                       (EVP_PKEY_CTX *)sVar6._M_extent._M_extent_value._M_extent_value);
    sVar7 = rawText(this);
    if (this->info == (Info *)0x0) {
      pSVar3 = (SourceLocation *)&SourceLocation::NoLocation;
    }
    else {
      pSVar3 = &this->info->location;
    }
    iVar1 = clone(this,(__fn *)alloc,(void *)CONCAT44(extraout_var_00,iVar1),__flags,
                  (void *)sVar7._M_len,sVar7._M_str,*pSVar3);
    uVar2 = CONCAT44(extraout_var_01,iVar1);
    SmallVectorBase<slang::parsing::Trivia>::cleanup
              (&triviaBuffer.super_SmallVectorBase<slang::parsing::Trivia>,(EVP_PKEY_CTX *)alloc);
    pIVar5 = extraout_RDX_01;
  }
  TVar8.info = pIVar5;
  TVar8.kind = (short)uVar2;
  TVar8._2_1_ = (char)((ulong)uVar2 >> 0x10);
  TVar8.numFlags.raw = (char)((ulong)uVar2 >> 0x18);
  TVar8.rawLen = (int)((ulong)uVar2 >> 0x20);
  return TVar8;
}

Assistant:

Token Token::deepClone(BumpAllocator& alloc) const {
    if (!info) {
        // No extra information, don't alloc extra info
        // If allocated it, the valid() function would fail
        return *this;
    }

    SmallVector<Trivia> triviaBuffer(trivia().size(), UninitializedTag());
    for (const auto& t : trivia())
        triviaBuffer.push_back(t.clone(alloc, true));
    return clone(alloc, triviaBuffer.copy(alloc), rawText(), location());
}